

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O1

void __thiscall Rml::ElementStyle::DirtyPropertiesWithUnits(ElementStyle *this,Units units)

{
  NodePtr pDVar1;
  PropertiesIterator it;
  PropertiesIterator local_70;
  
  Iterate(&local_70,this);
  if (local_70.at_end == false) {
    do {
      pDVar1 = local_70.it_style.mKeyVals;
      if (local_70.it_style.mKeyVals == local_70.it_style_end.mKeyVals) {
        pDVar1 = local_70.it_definition.mKeyVals;
      }
      if (((pDVar1->mData).second.unit & units) != UNKNOWN) {
        PropertyIdSet::Insert(&this->dirty_properties,(pDVar1->mData).first);
      }
      PropertiesIterator::operator++(&local_70);
    } while (local_70.at_end == false);
  }
  return;
}

Assistant:

void ElementStyle::DirtyPropertiesWithUnits(Units units)
{
	// Dirty all the properties of this element that use the unit(s).
	for (auto it = Iterate(); !it.AtEnd(); ++it)
	{
		auto name_property_pair = *it;
		PropertyId id = name_property_pair.first;
		const Property& property = name_property_pair.second;
		if (Any(property.unit & units))
			DirtyProperty(id);
	}
}